

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandDisjoint(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pNtk;
  char *pcVar5;
  char *pcVar6;
  uint fShort;
  uint local_4c;
  uint local_48;
  
  pAVar4 = Abc_FrameReadNtk(pAbc);
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar1 = true;
  local_4c = 0;
  local_48 = 0;
  fShort = 0;
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"grvpsh");
    switch(iVar3) {
    case 0x70:
      local_48 = local_48 ^ 1;
      break;
    case 0x71:
    case 0x74:
    case 0x75:
switchD_001f3ee6_caseD_71:
      iVar3 = -2;
      Abc_Print(-2,"usage: dsd [-grvpsh]\n");
      Abc_Print(-2,"\t     decomposes the network using disjoint-support decomposition\n");
      pcVar5 = "global";
      if (!bVar1) {
        pcVar5 = "local";
      }
      Abc_Print(-2,"\t-g     : toggle DSD of global and local functions [default = %s]\n",pcVar5);
      pcVar5 = "recursive DSD/MUX";
      if (!bVar2) {
        pcVar5 = "simple DSD";
      }
      Abc_Print(-2,"\t-r     : toggle recursive DSD/MUX and simple DSD [default = %s]\n",pcVar5);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_4c == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : prints DSD statistics and runtime [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_48 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-p     : prints DSD structure to the standard output [default = %s]\n",pcVar5)
      ;
      if (fShort == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s     : use short PI names when printing DSD structure [default = %s]\n",
                pcVar6);
      pcVar5 = "\t-h     : print the command usage\n";
LAB_001f4141:
      Abc_Print(iVar3,pcVar5);
      return 1;
    case 0x72:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x73:
      fShort = fShort ^ 1;
      break;
    case 0x76:
      local_4c = local_4c ^ 1;
      break;
    default:
      if (iVar3 == -1) {
        if (pAVar4 == (Abc_Ntk_t *)0x0) {
          pcVar5 = "Empty network.\n";
        }
        else if (bVar1) {
          if (pAVar4->ntkType == ABC_NTK_STRASH) {
            pAVar4 = Abc_NtkDsdGlobal(pAVar4,local_4c,local_48,fShort);
          }
          else {
            pNtk = Abc_NtkStrash(pAVar4,0,0,0);
            pAVar4 = Abc_NtkDsdGlobal(pNtk,local_4c,local_48,fShort);
            Abc_NtkDelete(pNtk);
          }
          if (pAVar4 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar4);
            return 0;
          }
          pcVar5 = "Global DSD has failed.\n";
        }
        else if (bVar2) {
          if ((pAVar4->ntkFunc == ABC_FUNC_BDD) && (pAVar4->ntkType == ABC_NTK_LOGIC)) {
            if (local_4c != 0) {
              Abc_Print(1,"Performing recursive DSD and MUX decomposition of local functions.\n");
            }
            iVar3 = Abc_NtkDsdLocal(pAVar4,local_4c,1);
            if (iVar3 != 0) {
              return 0;
            }
            pcVar5 = "Recursive DSD has failed.\n";
LAB_001f4129:
            Abc_Print(-1,pcVar5);
            return 0;
          }
          pcVar5 = "This command is only applicable to logic BDD networks.\n";
        }
        else {
          if ((pAVar4->ntkFunc == ABC_FUNC_BDD) && (pAVar4->ntkType == ABC_NTK_LOGIC)) {
            if (local_4c != 0) {
              Abc_Print(1,"Performing simple non-recursive DSD of local functions.\n");
            }
            iVar3 = Abc_NtkDsdLocal(pAVar4,local_4c,0);
            if (iVar3 != 0) {
              return 0;
            }
            pcVar5 = "Simple DSD of local functions has failed.\n";
            goto LAB_001f4129;
          }
          pcVar5 = "This command is only applicable to logic BDD networks (run \"bdd\").\n";
        }
        iVar3 = -1;
        goto LAB_001f4141;
      }
      if (iVar3 != 0x67) goto switchD_001f3ee6_caseD_71;
      bVar1 = (bool)(bVar1 ^ 1);
    }
  } while( true );
}

Assistant:

int Abc_CommandDisjoint( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes, * pNtkNew;
    int fGlobal, fRecursive, fVerbose, fPrint, fShort, c;

    extern Abc_Ntk_t * Abc_NtkDsdGlobal( Abc_Ntk_t * pNtk, int fVerbose, int fPrint, int fShort );
    extern int         Abc_NtkDsdLocal( Abc_Ntk_t * pNtk, int fVerbose, int fRecursive );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fGlobal    = 1;
    fRecursive = 0;
    fVerbose   = 0;
    fPrint     = 0;
    fShort     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "grvpsh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'g':
                fGlobal ^= 1;
                break;
            case 'r':
                fRecursive ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'p':
                fPrint ^= 1;
                break;
            case 's':
                fShort ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fGlobal )
    {
//        Abc_Print( 0, "Performing DSD of global functions of the network.\n" );
        // get the new network
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            pNtkNew = Abc_NtkStrash( pNtk, 0, 0, 0 );
            pNtkRes = Abc_NtkDsdGlobal( pNtkNew, fVerbose, fPrint, fShort );
            Abc_NtkDelete( pNtkNew );
        }
        else
        {
            pNtkRes = Abc_NtkDsdGlobal( pNtk, fVerbose, fPrint, fShort );
        }
        if ( pNtkRes == NULL )
        {
            Abc_Print( -1, "Global DSD has failed.\n" );
            return 1;
        }
        // replace the current network
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    }
    else if ( fRecursive )
    {
        if ( !Abc_NtkIsBddLogic( pNtk ) )
        {
            Abc_Print( -1, "This command is only applicable to logic BDD networks.\n" );
            return 1;
        }
        if ( fVerbose )
            Abc_Print( 1, "Performing recursive DSD and MUX decomposition of local functions.\n" );
        if ( !Abc_NtkDsdLocal( pNtk, fVerbose, fRecursive ) )
            Abc_Print( -1, "Recursive DSD has failed.\n" );
    }
    else
    {
        if ( !Abc_NtkIsBddLogic( pNtk ) )
        {
            Abc_Print( -1, "This command is only applicable to logic BDD networks (run \"bdd\").\n" );
            return 1;
        }
        if ( fVerbose )
            Abc_Print( 1, "Performing simple non-recursive DSD of local functions.\n" );
        if ( !Abc_NtkDsdLocal( pNtk, fVerbose, fRecursive ) )
            Abc_Print( -1, "Simple DSD of local functions has failed.\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: dsd [-grvpsh]\n" );
    Abc_Print( -2, "\t     decomposes the network using disjoint-support decomposition\n" );
    Abc_Print( -2, "\t-g     : toggle DSD of global and local functions [default = %s]\n", fGlobal? "global": "local" );
    Abc_Print( -2, "\t-r     : toggle recursive DSD/MUX and simple DSD [default = %s]\n", fRecursive? "recursive DSD/MUX": "simple DSD" );
    Abc_Print( -2, "\t-v     : prints DSD statistics and runtime [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-p     : prints DSD structure to the standard output [default = %s]\n", fPrint? "yes": "no" );
    Abc_Print( -2, "\t-s     : use short PI names when printing DSD structure [default = %s]\n", fShort? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}